

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseXMLParser.cpp
# Opt level: O3

bool __thiscall
Rml::BaseXMLParser::FindString(BaseXMLParser *this,char *string,String *data,bool escape_brackets)

{
  char cVar1;
  char c;
  bool bVar2;
  char *pcVar3;
  ulong uVar4;
  char previous;
  bool in_brackets;
  bool in_string;
  bool local_42;
  bool local_41;
  char *local_40;
  String *local_38;
  
  cVar1 = *string;
  local_42 = false;
  local_41 = false;
  if (this->xml_index < (this->xml_source)._M_string_length) {
    previous = '\0';
    local_40 = string;
    local_38 = data;
    do {
      c = Look(this);
      if (c == '\n') {
        this->line_number = this->line_number + 1;
      }
      if ((escape_brackets) &&
         (pcVar3 = XMLParseTools::ParseDataBrackets(&local_42,&local_41,c,previous),
         pcVar3 != (char *)0x0)) {
        Log::Message(LT_WARNING,"XML parse error. %s",pcVar3);
        return false;
      }
      if (((c == cVar1) && (local_42 == false)) && (bVar2 = PeekString(this,local_40,true), bVar2))
      {
        return true;
      }
      ::std::__cxx11::string::push_back((char)local_38);
      uVar4 = this->xml_index + 1;
      this->xml_index = uVar4;
      previous = c;
    } while (uVar4 < (this->xml_source)._M_string_length);
  }
  return false;
}

Assistant:

bool BaseXMLParser::FindString(const char* string, String& data, bool escape_brackets)
{
	const char first_char = string[0];
	bool in_brackets = false;
	bool in_string = false;
	char previous = 0;

	while (!AtEnd())
	{
		const char c = Look();

		// Count line numbers
		if (c == '\n')
		{
			line_number++;
		}

		if (escape_brackets)
		{
			const char* error_str = XMLParseTools::ParseDataBrackets(in_brackets, in_string, c, previous);
			if (error_str)
			{
				Log::Message(Log::LT_WARNING, "XML parse error. %s", error_str);
				return false;
			}
		}

		if (c == first_char && !in_brackets && PeekString(string))
		{
			return true;
		}

		data += c;
		previous = c;
		Next();
	}

	return false;
}